

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O1

size_t __thiscall
ktx::ValidationContext::calcLevelOffset
          (ValidationContext *this,size_t firstLevelOffset,size_t alignment,uint32_t level)

{
  uint uVar1;
  size_t sVar2;
  uint32_t level_00;
  ulong uVar3;
  size_t sVar4;
  
  if ((this->header).vkFormat == 0) {
    __assert_fail("header.vkFormat != VK_FORMAT_UNDEFINED",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/validate.cpp"
                  ,0x27b,"size_t ktx::ValidationContext::calcLevelOffset(size_t, size_t, uint32_t)")
    ;
  }
  if ((this->header).supercompressionScheme != 0) {
    __assert_fail("header.supercompressionScheme == KTX_SS_NONE",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/validate.cpp"
                  ,0x27c,"size_t ktx::ValidationContext::calcLevelOffset(size_t, size_t, uint32_t)")
    ;
  }
  if (this->numLevels <= level) {
    __assert_fail("level < numLevels",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/validate.cpp"
                  ,0x27e,"size_t ktx::ValidationContext::calcLevelOffset(size_t, size_t, uint32_t)")
    ;
  }
  if (alignment == 0) {
    __assert_fail("alignment != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/utility.h"
                  ,0x1d,"T ktx::align(const T, const T) [T = unsigned long]");
  }
  uVar3 = (alignment + firstLevelOffset) - 1;
  sVar4 = uVar3 - uVar3 % alignment;
  level_00 = this->numLevels - 1;
  if (level < level_00) {
    uVar1 = this->numLayers;
    do {
      sVar2 = calcLayerSize(this,level_00);
      uVar3 = sVar2 * uVar1 + sVar4 + (alignment - 1);
      sVar4 = uVar3 - uVar3 % alignment;
      level_00 = level_00 - 1;
    } while (level < level_00);
  }
  return sVar4;
}

Assistant:

size_t ValidationContext::calcLevelOffset(size_t firstLevelOffset, size_t alignment, uint32_t level) {
    // This function is only useful when the following 2 conditions are met
    // as otherwise we have no idea what the size of a level ought to be.
    assert(header.vkFormat != VK_FORMAT_UNDEFINED);
    assert(header.supercompressionScheme == KTX_SS_NONE);

    assert(level < numLevels);
    // Calculate the expected base offset in the file
    size_t levelOffset = align(firstLevelOffset, alignment);
    for (uint32_t i = numLevels - 1; i > level; --i) {
        levelOffset += calcLevelSize(i);
        levelOffset = align(levelOffset, alignment);
    }
    return levelOffset;
}